

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakeHostSystemInformationCommand::GetValue
          (cmCMakeHostSystemInformationCommand *this,SystemInformation *info,string *key,
          string *value)

{
  bool bVar1;
  uint uVar2;
  char *value_00;
  size_t value_01;
  char *this_00;
  string *__return_storage_ptr__;
  cmCMakeHostSystemInformationCommand *pcStack_70;
  string e;
  string local_40;
  
  pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b32fb;
  bVar1 = std::operator==(key,"NUMBER_OF_LOGICAL_CORES");
  if (bVar1) {
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU(info);
LAB_0023eea3:
    value_01 = (size_t)uVar2;
LAB_0023eead:
    ValueToString_abi_cxx11_(&e,pcStack_70,value_01);
  }
  else {
    pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b3313;
    bVar1 = std::operator==(key,"NUMBER_OF_PHYSICAL_CORES");
    if (bVar1) {
      uVar2 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(info);
      goto LAB_0023eea3;
    }
    this_00 = "HOSTNAME";
    bVar1 = std::operator==(key,"HOSTNAME");
    if (!bVar1) {
      bVar1 = std::operator==(key,"FQDN");
      if (bVar1) {
        cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_(&local_40,info);
        std::__cxx11::string::string((string *)&e,(string *)&local_40);
        std::__cxx11::string::operator=((string *)value,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        __return_storage_ptr__ = &local_40;
        goto LAB_0023eec0;
      }
      pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b333a;
      bVar1 = std::operator==(key,"TOTAL_VIRTUAL_MEMORY");
      if (bVar1) {
        value_01 = cmsys::SystemInformation::GetTotalVirtualMemory(info);
      }
      else {
        pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b334f;
        bVar1 = std::operator==(key,"AVAILABLE_VIRTUAL_MEMORY");
        if (bVar1) {
          value_01 = cmsys::SystemInformation::GetAvailableVirtualMemory(info);
        }
        else {
          pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b3368;
          bVar1 = std::operator==(key,"TOTAL_PHYSICAL_MEMORY");
          if (bVar1) {
            value_01 = cmsys::SystemInformation::GetTotalPhysicalMemory(info);
          }
          else {
            pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b337e;
            bVar1 = std::operator==(key,"AVAILABLE_PHYSICAL_MEMORY");
            if (bVar1) {
              value_01 = cmsys::SystemInformation::GetAvailablePhysicalMemory(info);
            }
            else {
              pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4b3398;
              bVar1 = std::operator==(key,"IS_64BIT");
              if (bVar1) {
                bVar1 = cmsys::SystemInformation::Is64Bits(info);
              }
              else {
                bVar1 = std::operator==(key,"HAS_FPU");
                if (bVar1) {
                  pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x800000;
                }
                else {
                  bVar1 = std::operator==(key,"HAS_MMX");
                  if (bVar1) {
                    pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x1;
                  }
                  else {
                    bVar1 = std::operator==(key,"HAS_MMX_PLUS");
                    if (bVar1) {
                      pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x2;
                    }
                    else {
                      bVar1 = std::operator==(key,"HAS_SSE");
                      if (bVar1) {
                        pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x4;
                      }
                      else {
                        bVar1 = std::operator==(key,"HAS_SSE2");
                        if (bVar1) {
                          pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x8;
                        }
                        else {
                          bVar1 = std::operator==(key,"HAS_SSE_FP");
                          if (bVar1) {
                            pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x800;
                          }
                          else {
                            bVar1 = std::operator==(key,"HAS_SSE_MMX");
                            if (bVar1) {
                              pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x1000;
                            }
                            else {
                              bVar1 = std::operator==(key,"HAS_AMD_3DNOW");
                              if (bVar1) {
                                pcStack_70 = (cmCMakeHostSystemInformationCommand *)&DAT_00000010;
                              }
                              else {
                                bVar1 = std::operator==(key,"HAS_AMD_3DNOW_PLUS");
                                if (bVar1) {
                                  pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x20;
                                }
                                else {
                                  bVar1 = std::operator==(key,"HAS_IA64");
                                  if (bVar1) {
                                    pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x40;
                                  }
                                  else {
                                    bVar1 = std::operator==(key,"HAS_SERIAL_NUMBER");
                                    if (!bVar1) {
                                      this_00 = "PROCESSOR_NAME";
                                      bVar1 = std::operator==(key,"PROCESSOR_NAME");
                                      if (bVar1) {
                                        value_00 = cmsys::SystemInformation::
                                                   GetExtendedProcessorName(info);
                                      }
                                      else {
                                        bVar1 = std::operator==(key,"PROCESSOR_DESCRIPTION");
                                        if (bVar1) {
                                          __return_storage_ptr__ = &e;
                                          cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                                                    (__return_storage_ptr__,info);
                                          std::__cxx11::string::operator=
                                                    ((string *)value,
                                                     (string *)__return_storage_ptr__);
                                          goto LAB_0023eec0;
                                        }
                                        this_00 = "PROCESSOR_SERIAL_NUMBER";
                                        bVar1 = std::operator==(key,"PROCESSOR_SERIAL_NUMBER");
                                        if (bVar1) {
                                          value_00 = cmsys::SystemInformation::
                                                     GetProcessorSerialNumber(info);
                                        }
                                        else {
                                          this_00 = "OS_NAME";
                                          bVar1 = std::operator==(key,"OS_NAME");
                                          if (bVar1) {
                                            value_00 = cmsys::SystemInformation::GetOSName(info);
                                          }
                                          else {
                                            this_00 = "OS_RELEASE";
                                            bVar1 = std::operator==(key,"OS_RELEASE");
                                            if (bVar1) {
                                              value_00 = cmsys::SystemInformation::GetOSRelease
                                                                   (info);
                                            }
                                            else {
                                              this_00 = "OS_VERSION";
                                              bVar1 = std::operator==(key,"OS_VERSION");
                                              if (bVar1) {
                                                value_00 = cmsys::SystemInformation::GetOSVersion
                                                                     (info);
                                              }
                                              else {
                                                this_00 = "OS_PLATFORM";
                                                bVar1 = std::operator==(key,"OS_PLATFORM");
                                                if (!bVar1) {
                                                  std::operator+(&e,"does not recognize <key> ",key)
                                                  ;
                                                  cmCommand::SetError(&this->super_cmCommand,&e);
                                                  std::__cxx11::string::~string((string *)&e);
                                                  return false;
                                                }
                                                value_00 = cmsys::SystemInformation::GetOSPlatform
                                                                     (info);
                                              }
                                            }
                                          }
                                        }
                                      }
                                      goto LAB_0023eeee;
                                    }
                                    pcStack_70 = (cmCMakeHostSystemInformationCommand *)0x200;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature(info,(long)pcStack_70);
              }
              value_01 = (size_t)bVar1;
            }
          }
        }
      }
      goto LAB_0023eead;
    }
    value_00 = cmsys::SystemInformation::GetHostname(info);
LAB_0023eeee:
    ValueToString_abi_cxx11_(&e,(cmCMakeHostSystemInformationCommand *)this_00,value_00);
  }
  __return_storage_ptr__ = &e;
  std::__cxx11::string::operator=((string *)value,(string *)__return_storage_ptr__);
LAB_0023eec0:
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return true;
}

Assistant:

bool cmCMakeHostSystemInformationCommand::GetValue(
  cmsys::SystemInformation& info, std::string const& key, std::string& value)
{
  if (key == "NUMBER_OF_LOGICAL_CORES") {
    value = this->ValueToString(info.GetNumberOfLogicalCPU());
  } else if (key == "NUMBER_OF_PHYSICAL_CORES") {
    value = this->ValueToString(info.GetNumberOfPhysicalCPU());
  } else if (key == "HOSTNAME") {
    value = this->ValueToString(info.GetHostname());
  } else if (key == "FQDN") {
    value = this->ValueToString(info.GetFullyQualifiedDomainName());
  } else if (key == "TOTAL_VIRTUAL_MEMORY") {
    value = this->ValueToString(info.GetTotalVirtualMemory());
  } else if (key == "AVAILABLE_VIRTUAL_MEMORY") {
    value = this->ValueToString(info.GetAvailableVirtualMemory());
  } else if (key == "TOTAL_PHYSICAL_MEMORY") {
    value = this->ValueToString(info.GetTotalPhysicalMemory());
  } else if (key == "AVAILABLE_PHYSICAL_MEMORY") {
    value = this->ValueToString(info.GetAvailablePhysicalMemory());
  } else if (key == "IS_64BIT") {
    value = this->ValueToString(info.Is64Bits());
  } else if (key == "HAS_FPU") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_FPU));
  } else if (key == "HAS_MMX") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_MMX));
  } else if (key == "HAS_MMX_PLUS") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_MMX_PLUS));
  } else if (key == "HAS_SSE") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_SSE));
  } else if (key == "HAS_SSE2") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_SSE2));
  } else if (key == "HAS_SSE_FP") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SSE_FP));
  } else if (key == "HAS_SSE_MMX") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SSE_MMX));
  } else if (key == "HAS_AMD_3DNOW") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_AMD_3DNOW));
  } else if (key == "HAS_AMD_3DNOW_PLUS") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_AMD_3DNOW_PLUS));
  } else if (key == "HAS_IA64") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_IA64));
  } else if (key == "HAS_SERIAL_NUMBER") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SERIALNUMBER));
  } else if (key == "PROCESSOR_NAME") {
    value = this->ValueToString(info.GetExtendedProcessorName());
  } else if (key == "PROCESSOR_DESCRIPTION") {
    value = info.GetCPUDescription();
  } else if (key == "PROCESSOR_SERIAL_NUMBER") {
    value = this->ValueToString(info.GetProcessorSerialNumber());
  } else if (key == "OS_NAME") {
    value = this->ValueToString(info.GetOSName());
  } else if (key == "OS_RELEASE") {
    value = this->ValueToString(info.GetOSRelease());
  } else if (key == "OS_VERSION") {
    value = this->ValueToString(info.GetOSVersion());
  } else if (key == "OS_PLATFORM") {
    value = this->ValueToString(info.GetOSPlatform());
#ifdef HAVE_VS_SETUP_HELPER
  } else if (key == "VS_15_DIR") {
    // If generating for the VS 15 IDE, use the same instance.
    cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
    if (cmHasLiteralPrefix(gg->GetName(), "Visual Studio 15 ")) {
      cmGlobalVisualStudioVersionedGenerator* vs15gen =
        static_cast<cmGlobalVisualStudioVersionedGenerator*>(gg);
      if (vs15gen->GetVSInstance(value)) {
        return true;
      }
    }

    // Otherwise, find a VS 15 instance ourselves.
    cmVSSetupAPIHelper vsSetupAPIHelper(15);
    if (vsSetupAPIHelper.GetVSInstanceInfo(value)) {
      cmSystemTools::ConvertToUnixSlashes(value);
    }
  } else if (key == "VS_16_DIR") {
    // If generating for the VS 16 IDE, use the same instance.
    cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
    if (cmHasLiteralPrefix(gg->GetName(), "Visual Studio 16 ")) {
      cmGlobalVisualStudioVersionedGenerator* vs16gen =
        static_cast<cmGlobalVisualStudioVersionedGenerator*>(gg);
      if (vs16gen->GetVSInstance(value)) {
        return true;
      }
    }

    // Otherwise, find a VS 16 instance ourselves.
    cmVSSetupAPIHelper vsSetupAPIHelper(16);
    if (vsSetupAPIHelper.GetVSInstanceInfo(value)) {
      cmSystemTools::ConvertToUnixSlashes(value);
    }
#endif
  } else {
    std::string e = "does not recognize <key> " + key;
    this->SetError(e);
    return false;
  }

  return true;
}